

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O2

void G_NewInit(void)

{
  byte *pbVar1;
  uint uVar2;
  DThinker *pDVar3;
  DThinker *pDVar4;
  player_t *this;
  long lVar5;
  userinfo_t saved_ui;
  TThinkerIterator<APlayerPawn> it;
  
  TThinkerIterator<APlayerPawn>::TThinkerIterator
            ((TThinkerIterator<APlayerPawn> *)&it.super_FThinkerIterator,4);
  pDVar3 = FThinkerIterator::Next(&it.super_FThinkerIterator);
  while (pDVar3 != (DThinker *)0x0) {
    pDVar4 = FThinkerIterator::Next(&it.super_FThinkerIterator);
    pbVar1 = (byte *)((long)&pDVar3[7].super_DObject._vptr_DObject + 4);
    *pbVar1 = *pbVar1 | 0x18;
    (*(pDVar3->super_DObject)._vptr_DObject[4])(pDVar3);
    pDVar3 = pDVar4;
  }
  G_ClearSnapshots();
  ST_SetNeedRefresh();
  netgame = false;
  multiplayer = false;
  if (demoplayback == true) {
    C_RestoreCVars();
    demoplayback = false;
    D_SetupUserInfo();
  }
  this = (player_t *)&players;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TMap
              (&saved_ui.
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              (&saved_ui.
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
               &(this->userinfo).
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
    uVar2 = this->cheats;
    player_t::~player_t(this);
    player_t::player_t(this);
    this->cheats = this->cheats | uVar2 & 0x20;
    this->playerstate = '\x01';
    playeringame[lVar5] = false;
    TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::TransferFrom
              (&(this->userinfo).
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>,
               &saved_ui.
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
    userinfo_t::~userinfo_t
              ((userinfo_t *)
               &saved_ui.
                super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>);
    this = this + 1;
  }
  FString::operator=(&BackupSaveName,(char *)"");
  consoleplayer = 0;
  NextSkill = -1;
  return;
}

Assistant:

void G_NewInit ()
{
	int i;

	// Destory all old player refrences that may still exist
	TThinkerIterator<APlayerPawn> it(STAT_TRAVELLING);
	APlayerPawn *pawn, *next;

	next = it.Next();
	while ((pawn = next) != NULL)
	{
		next = it.Next();
		pawn->flags |= MF_NOSECTOR | MF_NOBLOCKMAP;
		pawn->Destroy();
	}

	G_ClearSnapshots ();
	ST_SetNeedRefresh();
	netgame = false;
	multiplayer = false;
	if (demoplayback)
	{
		C_RestoreCVars ();
		demoplayback = false;
		D_SetupUserInfo ();
	}
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		player_t *p = &players[i];
		userinfo_t saved_ui;
		saved_ui.TransferFrom(players[i].userinfo);
		int chasecam = p->cheats & CF_CHASECAM;
		p->~player_t();
		::new(p) player_t;
		players[i].cheats |= chasecam;
		players[i].playerstate = PST_DEAD;
		playeringame[i] = 0;
		players[i].userinfo.TransferFrom(saved_ui);
	}
	BackupSaveName = "";
	consoleplayer = 0;
	NextSkill = -1;
}